

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  __uid_t _Var1;
  int iVar2;
  int iVar3;
  
  _Var1 = getuid();
  if (_Var1 == 0) {
    init_hasargoption();
    parse_command(argc,argv);
    return 0;
  }
  iVar3 = -0x37;
  if ((byte)(ispring::xout[0x3c] - 0x30) < 10) {
    iVar2 = -0x30;
LAB_0010704c:
    printf("%s",(&PTR_anon_var_dwarf_2a93_00151620)[iVar2 + (uint)ispring::xout[0x3c]]);
  }
  else {
    iVar2 = -0x37;
    if ((byte)(ispring::xout[0x3c] + 0xbf) < 6) goto LAB_0010704c;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"cip requires admin privileges to run",0x24);
  if ((byte)(ispring::xout[0x37] - 0x30) < 10) {
    iVar3 = -0x30;
  }
  else if (5 < (byte)(ispring::xout[0x37] + 0xbf)) goto LAB_001070bb;
  printf("%s",(&PTR_anon_var_dwarf_2a93_00151620)[iVar3 + (uint)ispring::xout[0x37]]);
LAB_001070bb:
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
  std::ostream::put('\b');
  std::ostream::flush();
  return 1;
}

Assistant:

int main(int argc,char* argv[]){
    if(!ispring::OS::isAdmin()){
        std::cout << ispring::xout.light_red << "cip requires admin privileges to run" << ispring::xout.white << std::endl;
        return 1;
    }
    init_hasargoption();
	parse_command(argc,argv);
	return 0;
}